

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.cpp
# Opt level: O2

BarcodeMatrix * __thiscall
ZXing::Pdf417::Encoder::generateBarcodeLogic
          (BarcodeMatrix *__return_storage_ptr__,Encoder *this,wstring *msg,int errorCorrectionLevel
          )

{
  short *psVar1;
  uint uVar2;
  int j;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  invalid_argument *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  CharacterSet in_R8B;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  int local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  uint local_b0;
  int n;
  vector<int,_std::allocator<int>_> dataCodewords;
  vector<int,_std::allocator<int>_> e;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  vector<int,_std::allocator<int>_> highLevel;
  ulong uVar18;
  
  if (8 < (uint)errorCorrectionLevel) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar8,"Error correction level must be between 0 and 8!");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar15 = 2 << ((byte)errorCorrectionLevel & 0x1f);
  uVar18 = (ulong)uVar15;
  local_c0 = HighLevelEncoder::EncodeHighLevel
                       (&highLevel,(HighLevelEncoder *)msg,(wstring *)(ulong)this->_compaction,
                        (uint)this->_encoding,in_R8B);
  uVar4 = this->_minCols;
  uVar3 = this->_minRows;
  uVar2 = (uint)((ulong)((long)highLevel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)highLevel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  iVar19 = uVar2 + 1;
  iVar9 = uVar2 + uVar15 + 1;
  iVar11 = uVar4 * 0x11 + 0x45;
  fVar21 = 0.0;
  bVar20 = false;
  local_b8 = local_c0;
  for (uVar14 = uVar4; (int)uVar14 <= this->_maxCols; uVar14 = uVar14 + 1) {
    uVar16 = iVar9 / (int)uVar14 + 1;
    if ((int)(iVar9 + uVar14) <= (int)(uVar16 * uVar14)) {
      uVar16 = iVar9 / (int)uVar14;
    }
    if ((int)uVar16 < (int)uVar3) break;
    if (((int)uVar16 <= this->_maxRows) &&
       ((fVar22 = (float)(iVar11 / (int)uVar16) * 0.25, !bVar20 ||
        (ABS(fVar22 + -3.0) <= ABS(fVar21 + -3.0))))) {
      bVar20 = true;
      local_b8 = (vector<int,_std::allocator<int>_> *)(ulong)uVar16;
      local_c0 = (vector<int,_std::allocator<int>_> *)(ulong)uVar14;
      fVar21 = fVar22;
    }
    iVar11 = iVar11 + 0x11;
  }
  if (!bVar20) {
    iVar11 = iVar9 / (int)uVar4 + 1;
    if ((int)(iVar9 + uVar4) <= (int)(iVar11 * uVar4)) {
      iVar11 = iVar9 / (int)uVar4;
    }
    local_b8 = (vector<int,_std::allocator<int>_> *)(ulong)uVar3;
    local_c0._0_4_ = uVar4;
    if ((int)uVar3 <= iVar11) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar8,"Unable to fit message in columns");
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  if (0x3a0 < (int)(uVar15 + uVar2)) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar8,"Encoded message contains to many code words, message too big");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar9 = (uint)local_c0 * (uint)local_b8 - uVar15;
  n = iVar19;
  if (iVar19 < iVar9) {
    n = iVar9;
  }
  dataCodewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dataCodewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dataCodewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&dataCodewords,(long)n);
  std::vector<int,_std::allocator<int>_>::push_back(&dataCodewords,&n);
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&dataCodewords,
             (const_iterator)
             dataCodewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             highLevel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             highLevel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (iVar19 < iVar9) {
    iVar19 = iVar9;
  }
  iVar9 = 0;
  if (0 < (int)(~uVar2 + iVar19)) {
    iVar9 = ~uVar2 + iVar19;
  }
  while (bVar20 = iVar9 != 0, iVar9 = iVar9 + -1, bVar20) {
    e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ =
         900;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&dataCodewords,(int *)&e);
  }
  local_50._M_current = local_50._M_current & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            (&e,uVar18,(value_type_conflict3 *)&local_50,(allocator_type *)&local_58);
  uVar12 = (ulong)((long)dataCodewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)dataCodewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  local_58.current._M_current._4_4_ =
       e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
       _4_4_;
  local_58.current._M_current._0_4_ =
       e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
       _0_4_;
  uVar13 = 0;
  uVar6 = uVar12 & 0xffffffff;
  if ((int)uVar12 < 1) {
    uVar6 = uVar13;
  }
  for (; uVar13 != uVar6; uVar13 = uVar13 + 1) {
    iVar19 = (int)(*(uint *)((long)local_58.current._M_current + (uVar18 - 1) * 4) +
                  dataCodewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13]) % 0x3a1;
    psVar1 = *(short **)(EC_COEFFICIENTS + (ulong)(uint)errorCorrectionLevel * 8);
    for (uVar12 = (ulong)(uVar15 - 1); 0 < (int)uVar12; uVar12 = uVar12 - 1) {
      *(int *)((long)local_58.current._M_current + uVar12 * 4) =
           (int)((*(uint *)((long)local_58.current._M_current + (uVar12 - 1) * 4) -
                 (psVar1[uVar12] * iVar19) % 0x3a1) + 0x3a1) % 0x3a1;
    }
    iVar19 = (iVar19 * *psVar1) % 0x3a1;
    uVar3 = 0x3a1 - iVar19;
    uVar4 = -iVar19;
    if (uVar3 < 0x3a1) {
      uVar4 = uVar3;
    }
    *(uint *)local_58.current._M_current = uVar4;
  }
  for (uVar6 = 0; uVar18 != uVar6; uVar6 = uVar6 + 1) {
    if (*(uint *)((long)local_58.current._M_current + uVar6 * 4) != 0) {
      *(uint *)((long)local_58.current._M_current + uVar6 * 4) =
           0x3a1 - *(uint *)((long)local_58.current._M_current + uVar6 * 4);
    }
  }
  local_50._M_current =
       e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  std::vector<int,std::allocator<int>>::
  insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,void>
            ((vector<int,std::allocator<int>> *)&dataCodewords,
             (const_iterator)
             dataCodewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)&local_50,&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&e.super__Vector_base<int,_std::allocator<int>_>);
  bVar20 = this->_compact;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->_matrix).
           super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->_matrix).
           super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->_matrix).
  super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_matrix).
  super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->_currentRow = -1;
  BarcodeMatrix::init(__return_storage_ptr__,(EVP_PKEY_CTX *)((ulong)local_b8 & 0xffffffff));
  iVar19 = (int)((uint)local_b8 - 1) / 3;
  iVar11 = (int)((uint)local_b8 - 1) % 3 + errorCorrectionLevel * 3;
  iVar9 = (uint)local_c0 - 1;
  if ((int)(uint)local_c0 < 1) {
    local_c0._0_4_ = 0;
  }
  local_c8 = 0;
  if ((int)(uint)local_b8 < 1) {
    local_b8._0_4_ = 0;
  }
  local_b0 = (uint)local_c0;
  for (uVar4 = 0; uVar4 != (uint)local_b8; uVar4 = uVar4 + 1) {
    uVar18 = (ulong)uVar4 % 3;
    lVar7 = (long)__return_storage_ptr__->_currentRow + 1;
    __return_storage_ptr__->_currentRow = (int)lVar7;
    EncodeChar(0x1fea8,0x11,
               (__return_storage_ptr__->_matrix).
               super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7);
    iVar5 = iVar19;
    iVar10 = iVar9;
    if (((int)uVar18 != 0) && (iVar5 = iVar11, iVar10 = iVar19, (int)uVar18 != 1)) {
      iVar5 = iVar9;
      iVar10 = iVar11;
    }
    iVar17 = (uVar4 / 3) * 0x1e;
    EncodeChar(*(int *)(CODEWORD_TABLE + (long)(iVar5 + iVar17) * 4 + uVar18 * 0xe84),0x11,
               (__return_storage_ptr__->_matrix).
               super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
               ._M_impl.super__Vector_impl_data._M_start + __return_storage_ptr__->_currentRow);
    for (lVar7 = (long)local_c8; (int)local_b0 != lVar7; lVar7 = lVar7 + 1) {
      EncodeChar(*(int *)(CODEWORD_TABLE +
                         (long)dataCodewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar7] * 4 + uVar18 * 0xe84),0x11,
                 (__return_storage_ptr__->_matrix).
                 super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                 ._M_impl.super__Vector_impl_data._M_start + __return_storage_ptr__->_currentRow);
    }
    iVar5 = 1;
    if (bVar20 == false) {
      EncodeChar(*(int *)(CODEWORD_TABLE + (long)(iVar17 + iVar10) * 4 + uVar18 * 0xe84),0x11,
                 (__return_storage_ptr__->_matrix).
                 super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                 ._M_impl.super__Vector_impl_data._M_start + __return_storage_ptr__->_currentRow);
      iVar5 = 0x12;
    }
    EncodeChar(0x3fa29,iVar5,
               (__return_storage_ptr__->_matrix).
               super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
               ._M_impl.super__Vector_impl_data._M_start + __return_storage_ptr__->_currentRow);
    local_b0 = local_b0 + (uint)local_c0;
    local_c8 = (uint)local_c0 + local_c8;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&dataCodewords.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&highLevel.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

BarcodeMatrix
Encoder::generateBarcodeLogic(const std::wstring& msg, int errorCorrectionLevel) const
{
	if (errorCorrectionLevel < 0 || errorCorrectionLevel > 8) {
		throw std::invalid_argument("Error correction level must be between 0 and 8!");
	}

	//1. step: High-level encoding
	int errorCorrectionCodeWords = GetErrorCorrectionCodewordCount(errorCorrectionLevel);
	std::vector<int> highLevel = HighLevelEncoder::EncodeHighLevel(msg, _compaction, _encoding);
	
	int sourceCodeWords = Size(highLevel);

	int cols, rows;
	DetermineDimensions(_minCols, _maxCols, _minRows, _maxRows, sourceCodeWords, errorCorrectionCodeWords, cols, rows);

	int pad = GetNumberOfPadCodewords(sourceCodeWords, errorCorrectionCodeWords, cols, rows);

	//2. step: construct data codewords
	if (sourceCodeWords + errorCorrectionCodeWords + 1 > 929) { // +1 for symbol length CW
		throw std::invalid_argument("Encoded message contains to many code words, message too big");
	}
	int n = sourceCodeWords + pad + 1;
	std::vector<int> dataCodewords;
	dataCodewords.reserve(n);
	dataCodewords.push_back(n);
	dataCodewords.insert(dataCodewords.end(), highLevel.begin(), highLevel.end());
	for (int i = 0; i < pad; i++) {
		dataCodewords.push_back(900); //PAD characters
	}

	//3. step: Error correction
	GenerateErrorCorrection(dataCodewords, errorCorrectionLevel);

	//4. step: low-level encoding
	return EncodeLowLevel(dataCodewords, cols, rows, errorCorrectionLevel, _compact);
}